

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

bool __thiscall luna::Table::EraseArrayValue(Table *this,size_t index)

{
  vector<luna::Value,_std::allocator<luna::Value>_> *this_00;
  ulong uVar1;
  
  if (index != 0) {
    this_00 = (this->array_)._M_t.
              super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              .
              super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
              ._M_head_impl;
    if (this_00 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (long)*(pointer *)
                     ((long)&(this_00->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>
                             )._M_impl + 8) -
              *(long *)&(this_00->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                        _M_impl >> 4;
    }
    if (index <= uVar1) {
      std::vector<luna::Value,_std::allocator<luna::Value>_>::erase
                (this_00,(Value *)(index * 0x10 +
                                   *(long *)&(this_00->
                                             super__Vector_base<luna::Value,_std::allocator<luna::Value>_>
                                             )._M_impl + -0x10));
      return true;
    }
  }
  return false;
}

Assistant:

bool Table::EraseArrayValue(std::size_t index)
    {
        if (index < 1 || index > ArraySize())
            return false;

        auto it = array_->begin();
        std::advance(it, index - 1);
        array_->erase(it);
        return true;
    }